

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttrListImpl.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::VecAttrListImpl::getValue(VecAttrListImpl *this,char *name)

{
  bool bVar1;
  XMLCh *toDelete;
  XMLAttr *this_00;
  XMLCh *str1;
  XMLSize_t index;
  ulong getAt;
  XMLCh *pXVar2;
  ArrayJanitor<char16_t> janName;
  ArrayJanitor<char16_t> AStack_38;
  
  toDelete = XMLString::transcode(name,XMLPlatformUtils::fgMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,toDelete,XMLPlatformUtils::fgMemoryManager);
  pXVar2 = (XMLCh *)0x0;
  getAt = 0;
  do {
    if (this->fCount <= getAt) goto LAB_002ba5e1;
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
    str1 = XMLAttr::getQName(this_00);
    bVar1 = XMLString::equals(str1,toDelete);
    getAt = getAt + 1;
  } while (!bVar1);
  pXVar2 = this_00->fValue;
LAB_002ba5e1:
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
  return pXVar2;
}

Assistant:

const XMLCh* VecAttrListImpl::getValue(const char* const name) const
{
    // Temporarily transcode the name for lookup
    XMLCh* wideName = XMLString::transcode(name, XMLPlatformUtils::fgMemoryManager);
    ArrayJanitor<XMLCh> janName(wideName, XMLPlatformUtils::fgMemoryManager);

    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), wideName))
            return curElem->getValue();
    }
    return 0;
}